

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

double ** New2DArray<double>(uint f,uint s)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double **ppdVar3;
  double *pdVar4;
  uint in_ESI;
  uint in_EDI;
  uint fIt;
  double **temp;
  uint local_14;
  
  uVar2 = SUB168(ZEXT416(in_EDI) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_EDI) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppdVar3 = (double **)operator_new__(uVar2);
  auVar1 = ZEXT416(in_EDI * in_ESI) * ZEXT816(8);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar2);
  *ppdVar3 = pdVar4;
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    ppdVar3[local_14] = ppdVar3[local_14 - 1] + in_ESI;
  }
  return ppdVar3;
}

Assistant:

T **New2DArray(unsigned f , unsigned s)
{
	T **temp;
	temp = new T *[f];
	*temp = new T [f * s];
	for (unsigned fIt = 1 ; fIt < f ; fIt ++)
		temp[fIt] = temp[fIt -1] +  s ;
	return temp;
}